

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::DuckCatalog::PlanInsert
          (DuckCatalog *this,ClientContext *context,PhysicalPlanGenerator *planner,LogicalInsert *op
          ,optional_ptr<duckdb::PhysicalOperator,_true> plan)

{
  vector<duckdb::LogicalType,_true> *args;
  pointer *pprVar1;
  bool bVar2;
  OnConflictAction OVar3;
  TableCatalogEntry *args_1;
  iterator __position;
  bool bVar4;
  bool bVar5;
  int32_t iVar6;
  TaskScheduler *this_00;
  pointer pPVar7;
  PhysicalOperator *pPVar8;
  optional_ptr<duckdb::PhysicalOperator,_true> plan_local;
  reference_wrapper<duckdb::PhysicalOperator> local_70;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_68;
  vector<duckdb::PhysicalIndex,_true> *local_60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_58;
  OnConflictAction *local_50;
  idx_t *local_48;
  vector<duckdb::LogicalType,_true> *local_40;
  bool *local_38;
  
  plan_local = plan;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&plan_local);
  bVar4 = PhysicalPlanGenerator::PreserveInsertionOrder(context,plan_local.ptr);
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&plan_local);
  bVar5 = PhysicalPlanGenerator::UseBatchIndex(context,plan_local.ptr);
  this_00 = TaskScheduler::GetScheduler(context);
  iVar6 = TaskScheduler::NumberOfThreads(this_00);
  bVar2 = op->return_chunk;
  OVar3 = op->action_type;
  if ((op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&plan_local);
    plan_local.ptr = PhysicalPlanGenerator::ResolveDefaultsProjection(planner,op,plan_local.ptr);
  }
  args = &(op->super_LogicalOperator).types;
  args_1 = op->table;
  if ((OVar3 == THROW) && ((bVar5 & (bVar2 ^ 1U) & bVar4) != 0)) {
    pPVar7 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&planner->physical_plan);
    pPVar8 = PhysicalPlan::
             Make<duckdb::PhysicalBatchInsert,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,unsigned_long&>
                       (pPVar7,args,args_1,&op->bound_constraints,
                        &(op->super_LogicalOperator).estimated_cardinality);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&plan_local);
  }
  else {
    local_38 = &op->return_chunk;
    local_50 = &op->action_type;
    local_58 = &(op->super_LogicalOperator).expressions;
    local_60 = &op->set_columns;
    local_40 = &op->set_types;
    local_48 = &(op->super_LogicalOperator).estimated_cardinality;
    local_70._M_data._0_1_ = 1 < iVar6 & OVar3 != UPDATE & ((bVar4 | bVar2) ^ 1U);
    local_68 = &op->on_conflict_condition;
    pPVar7 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&planner->physical_plan);
    pPVar8 = PhysicalPlan::
             Make<duckdb::PhysicalInsert,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::PhysicalIndex,true>,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,bool&,bool,duckdb::OnConflictAction&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,duckdb::vector<unsigned_long,true>,bool&>
                       (pPVar7,args,args_1,&op->bound_constraints,local_58,local_60,local_40,
                        local_48,local_38,(bool *)&local_70,local_50,local_68,
                        &op->do_update_condition,&op->on_conflict_filter,&op->columns_to_fetch,
                        &op->update_is_del_and_insert);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&plan_local);
  }
  __position._M_current =
       (pPVar8->children).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar8->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_70._M_data = plan_local.ptr;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar8->children,__position,&local_70);
  }
  else {
    (__position._M_current)->_M_data = plan_local.ptr;
    pprVar1 = &(pPVar8->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return pPVar8;
}

Assistant:

PhysicalOperator &DuckCatalog::PlanInsert(ClientContext &context, PhysicalPlanGenerator &planner, LogicalInsert &op,
                                          optional_ptr<PhysicalOperator> plan) {
	D_ASSERT(plan);
	bool parallel_streaming_insert = !PhysicalPlanGenerator::PreserveInsertionOrder(context, *plan);
	bool use_batch_index = PhysicalPlanGenerator::UseBatchIndex(context, *plan);
	auto num_threads = TaskScheduler::GetScheduler(context).NumberOfThreads();
	if (op.return_chunk) {
		// not supported for RETURNING (yet?)
		parallel_streaming_insert = false;
		use_batch_index = false;
	}
	if (op.action_type != OnConflictAction::THROW) {
		// We don't support ON CONFLICT clause in batch insertion operation currently
		use_batch_index = false;
	}
	if (op.action_type == OnConflictAction::UPDATE) {
		// When we potentially need to perform updates, we have to check that row is not updated twice
		// that currently needs to be done for every chunk, which would add a huge bottleneck to parallelized insertion
		parallel_streaming_insert = false;
	}
	if (!op.column_index_map.empty()) {
		plan = planner.ResolveDefaultsProjection(op, *plan);
	}
	if (use_batch_index && !parallel_streaming_insert) {
		auto &insert = planner.Make<PhysicalBatchInsert>(op.types, op.table, std::move(op.bound_constraints),
		                                                 op.estimated_cardinality);
		insert.children.push_back(*plan);
		return insert;
	}

	auto &insert = planner.Make<PhysicalInsert>(
	    op.types, op.table, std::move(op.bound_constraints), std::move(op.expressions), std::move(op.set_columns),
	    std::move(op.set_types), op.estimated_cardinality, op.return_chunk,
	    parallel_streaming_insert && num_threads > 1, op.action_type, std::move(op.on_conflict_condition),
	    std::move(op.do_update_condition), std::move(op.on_conflict_filter), std::move(op.columns_to_fetch),
	    op.update_is_del_and_insert);
	insert.children.push_back(*plan);
	return insert;
}